

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O2

void asm_fparith(ASMState *as,IRIns *ir,x86Op xo)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  IRRef ref;
  Reg rr;
  int iVar4;
  Reg rb;
  uint allow;
  uint uVar5;
  
  uVar2 = (ir->field_0).op1;
  ref = (IRRef)uVar2;
  uVar3 = (ir->field_0).op2;
  bVar1 = *(byte *)((long)as->ir + (ulong)uVar3 * 8 + 6);
  if ((char)bVar1 < '\0') {
    allow = 0xffff0000;
  }
  else {
    allow = ~(1 << (bVar1 & 0x1f)) & 0xffff0000;
    as->weakset = as->weakset & (-2 << (bVar1 & 0x1f) | 0xfffffffeU >> 0x20 - (bVar1 & 0x1f));
  }
  rr = ra_dest(as,ir,allow);
  rb = rr;
  if ((uVar2 != uVar3) && (rb = (uint)bVar1, (char)bVar1 < '\0')) {
    iVar4 = asm_swapops(as,ir);
    uVar5 = (uint)uVar3;
    if (iVar4 == 0) {
      uVar5 = ref;
      ref = (uint)uVar3;
    }
    rb = asm_fuseload(as,ref,allow & ~(1 << (rr & 0x1f)));
    ref = uVar5;
  }
  emit_mrm(as,xo,rr,rb);
  ra_left(as,rr,ref);
  return;
}

Assistant:

static void asm_fparith(ASMState *as, IRIns *ir, x86Op xo)
{
  IRRef lref = ir->op1;
  IRRef rref = ir->op2;
  RegSet allow = RSET_FPR;
  Reg dest;
  Reg right = IR(rref)->r;
  if (ra_hasreg(right)) {
    rset_clear(allow, right);
    ra_noweak(as, right);
  }
  dest = ra_dest(as, ir, allow);
  if (lref == rref) {
    right = dest;
  } else if (ra_noreg(right)) {
    if (asm_swapops(as, ir)) {
      IRRef tmp = lref; lref = rref; rref = tmp;
    }
    right = asm_fuseload(as, rref, rset_clear(allow, dest));
  }
  emit_mrm(as, xo, dest, right);
  ra_left(as, dest, lref);
}